

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O3

bool __thiscall
crnlib::qdxt5::create_selector_clusters
          (qdxt5 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  weighted_vec *pwVar1;
  dxt5_block *pdVar2;
  weighted_vec *pwVar3;
  void *pvVar4;
  uint *puVar5;
  byte bVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  int iVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  uint uVar13;
  weighted_vec_array *pwVar14;
  elemental_vector *peVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *ptVar19;
  uint uVar20;
  float *pfVar21;
  bool bVar22;
  uint y;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  vector<unsigned_int> *pvVar29;
  float fVar30;
  vector<unsigned_int> selector_vec_remap [2];
  weighted_selector_vec_array selector_vecs [2];
  vec16F sv;
  elemental_vector *local_e0;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *local_c8;
  uint local_c0;
  uint local_bc;
  elemental_vector local_b8;
  elemental_vector local_a8;
  weighted_vec_array local_98;
  weighted_vec_array local_88;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_88.m_p = (weighted_vec *)0x0;
  local_88.m_size = 0;
  local_88.m_capacity = 0;
  local_98.m_p = (weighted_vec *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  local_a8.m_p = (void *)0x0;
  local_a8.m_size = 0;
  local_a8.m_capacity = 0;
  local_b8.m_p = (void *)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  uVar25 = this->m_num_blocks;
  pwVar14 = &local_98;
  local_e0 = &local_b8;
  uVar10 = CONCAT71((int7)((ulong)local_e0 >> 8),1);
  ptVar19 = (threaded_clusterizer<crnlib::vec<16U,_float>_> *)0x0;
  uVar20 = uVar25;
  local_c0 = max_selector_clusters;
  do {
    local_bc = (uint)uVar10;
    if (uVar25 == 0) {
      uVar25 = 0;
    }
    else {
      uVar28 = 0;
      local_c8 = ptVar19;
      do {
        pdVar2 = this->m_pDst_elements;
        uVar13 = this->m_elements_per_block * uVar28;
        if (ptVar19 ==
            (threaded_clusterizer<crnlib::vec<16U,_float>_> *)
            (ulong)(pdVar2[uVar13].m_endpoints[0] <= pdVar2[uVar13].m_endpoints[1])) {
          pdVar2 = pdVar2 + uVar13;
          iVar9 = 0;
          uVar16 = 0;
          pfVar21 = (float *)local_78;
          bVar22 = false;
          iVar23 = 0;
          do {
            iVar18 = (int)uVar16;
            iVar24 = 0;
            do {
              uVar13 = (uint)pdVar2->m_selectors[uVar16 >> 3];
              if ((uint)(iVar9 + iVar24) < 0xe) {
                uVar13 = (uint)CONCAT11(pdVar2->m_selectors[(uVar16 >> 3) + 1],
                                        pdVar2->m_selectors[uVar16 >> 3]);
              }
              uVar13 = uVar13 >> ((byte)uVar16 & 7) & 7;
              puVar12 = &g_dxt5_to_linear;
              if ((pdVar2->m_endpoints[1] < pdVar2->m_endpoints[0]) ||
                 (puVar12 = &g_dxt5_alpha6_to_linear, uVar13 < 6)) {
                fVar30 = (float)*(byte *)((long)puVar12 + (ulong)uVar13);
              }
              else {
                bVar22 = true;
                fVar30 = 0.0;
              }
              *pfVar21 = fVar30;
              pfVar21 = pfVar21 + 1;
              iVar24 = iVar24 + 1;
              uVar16 = (ulong)((int)uVar16 + 3);
            } while (iVar24 != 4);
            iVar23 = iVar23 + 1;
            uVar16 = (ulong)(iVar18 + 0xc);
            iVar9 = iVar9 + 4;
          } while (iVar23 != 4);
          ptVar19 = local_c8;
          if (!bVar22) {
            iVar9 = (uint)pdVar2->m_endpoints[0] - (uint)pdVar2->m_endpoints[1];
            uVar13 = iVar9 * iVar9;
            uVar25 = uVar13 >> 3;
            if (0x7ff < uVar25) {
              uVar25 = 0x800;
            }
            if (uVar13 < 8) {
              uVar25 = 1;
            }
            uVar16 = (ulong)pwVar14->m_size;
            uVar13 = pwVar14->m_size + 1;
            if ((uVar16 != 0xffffffff) && (pwVar14->m_capacity < uVar13)) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pwVar14,uVar13,true,0x44,
                         vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         ::object_mover,false);
            }
            pwVar14->m_size = uVar13;
            pwVar3 = pwVar14->m_p;
            pfVar21 = pwVar3[uVar16].m_vec.m_s + 0xc;
            *(undefined8 *)pfVar21 = local_48;
            *(undefined8 *)(pfVar21 + 2) = uStack_40;
            pfVar21 = pwVar3[uVar16].m_vec.m_s + 8;
            *(undefined8 *)pfVar21 = local_58;
            *(undefined8 *)(pfVar21 + 2) = uStack_50;
            pfVar21 = pwVar3[uVar16].m_vec.m_s + 4;
            *(undefined8 *)pfVar21 = local_68;
            *(undefined8 *)(pfVar21 + 2) = uStack_60;
            pwVar1 = pwVar3 + uVar16;
            (pwVar1->m_vec).m_s[0] = (float)local_78._0_4_;
            (pwVar1->m_vec).m_s[1] = (float)local_78._4_4_;
            (pwVar1->m_vec).m_s[2] = (float)uStack_70;
            (pwVar1->m_vec).m_s[3] = uStack_70._4_4_;
            pwVar3[uVar16].m_weight = uVar25;
            uVar13 = local_e0->m_size;
            if (local_e0->m_capacity <= uVar13) {
              elemental_vector::increase_capacity
                        (local_e0,uVar13 + 1,true,4,(object_mover)0x0,false);
              uVar13 = local_e0->m_size;
            }
            *(uint *)((long)local_e0->m_p + (ulong)uVar13 * 4) = uVar28;
            local_e0->m_size = local_e0->m_size + 1;
            uVar20 = this->m_num_blocks;
            ptVar19 = local_c8;
          }
        }
        uVar28 = uVar28 + 1;
        uVar25 = uVar20;
      } while (uVar28 < uVar20);
    }
    ptVar19 = (threaded_clusterizer<crnlib::vec<16U,_float>_> *)0x1;
    local_e0 = &local_a8;
    pwVar14 = &local_88;
    uVar10 = 0;
  } while ((local_bc & 1) != 0);
  pvVar29 = selector_cluster_indices->m_p;
  if (pvVar29 != (vector<unsigned_int> *)0x0) {
    uVar28 = selector_cluster_indices->m_size;
    if ((ulong)uVar28 != 0) {
      lVar27 = 0;
      do {
        pvVar4 = *(void **)((long)&pvVar29->m_p + lVar27);
        if (pvVar4 != (void *)0x0) {
          crnlib_free(pvVar4);
        }
        lVar27 = lVar27 + 0x10;
      } while ((ulong)uVar28 << 4 != lVar27);
      pvVar29 = selector_cluster_indices->m_p;
    }
    crnlib_free(pvVar29);
    selector_cluster_indices->m_p = (vector<unsigned_int> *)0x0;
    selector_cluster_indices->m_size = 0;
    selector_cluster_indices->m_capacity = 0;
  }
  uVar16 = (ulong)local_c0;
  local_c8 = &this->m_selector_clusterizer;
  pwVar14 = &local_98;
  peVar15 = &local_b8;
  bVar22 = true;
  do {
    while( true ) {
      uVar11 = (ulong)pwVar14->m_size;
      if (uVar11 != 0) break;
LAB_00142c1e:
      peVar15 = &local_a8;
      pwVar14 = &local_88;
      bVar8 = bVar22 == false;
      bVar22 = false;
      if (bVar8) {
        bVar8 = true;
        goto LAB_00142db3;
      }
    }
    uVar28 = this->m_num_blocks;
    if ((float)uVar11 / (float)uVar28 < 0.01) goto LAB_00142c1e;
    uVar28 = (uint)(((ulong)(uVar28 - 1) + uVar11 * uVar16) / (ulong)uVar28);
    if (uVar28 < 0x41) {
      uVar28 = 0x40;
    }
    if (pwVar14->m_size <= uVar28) goto LAB_00142c1e;
    local_78 = (undefined1  [8])0x0;
    uStack_70 = 0;
    uVar25 = this->m_progress_range + 0x10;
    if (bVar22) {
      uVar25 = this->m_progress_range;
    }
    this->m_progress_start = uVar25;
    this->m_progress_range = bVar22 ^ 0x11;
    bVar8 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                      (local_c8,pwVar14,uVar28,(vector<crnlib::vector<unsigned_int>_> *)local_78,
                       generate_codebook_progress_callback,this);
    if ((bVar8) && ((float)uStack_70 != 0.0)) {
      uVar28 = selector_cluster_indices->m_size;
      uVar13 = uVar28 + (int)(float)uStack_70;
      if (uVar13 < uVar28) {
        pvVar29 = selector_cluster_indices->m_p;
        uVar26 = -(int)(float)uStack_70;
        lVar27 = 0;
        do {
          pvVar4 = *(void **)((long)&pvVar29[uVar13].m_p + lVar27);
          if (pvVar4 != (void *)0x0) {
            crnlib_free(pvVar4);
          }
          lVar27 = lVar27 + 0x10;
        } while ((ulong)uVar26 << 4 != lVar27);
      }
      else {
        uVar26 = uVar28;
        if (selector_cluster_indices->m_capacity < uVar13) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)selector_cluster_indices,uVar13,true,0x10,(object_mover)0x0
                     ,false);
          uVar26 = selector_cluster_indices->m_size;
        }
        if (uVar13 - uVar26 != 0) {
          memset(selector_cluster_indices->m_p + uVar26,0,(ulong)(uVar13 - uVar26) << 4);
        }
      }
      selector_cluster_indices->m_size = uVar13;
      if ((float)uStack_70 != 0.0) {
        uVar11 = 0;
        do {
          uVar13 = uVar28 + (int)uVar11;
          pvVar29 = selector_cluster_indices->m_p;
          puVar5 = pvVar29[uVar13].m_p;
          pvVar29[uVar13].m_p = ((vector<unsigned_int> *)((long)local_78 + uVar11 * 0x10))->m_p;
          ((vector<unsigned_int> *)((long)local_78 + uVar11 * 0x10))->m_p = puVar5;
          uVar25 = pvVar29[uVar13].m_size;
          pvVar29[uVar13].m_size =
               ((vector<unsigned_int> *)((long)local_78 + uVar11 * 0x10))->m_size;
          ((vector<unsigned_int> *)((long)local_78 + uVar11 * 0x10))->m_size = uVar25;
          uVar25 = pvVar29[uVar13].m_capacity;
          pvVar29[uVar13].m_capacity =
               ((vector<unsigned_int> *)((long)local_78 + uVar11 * 0x10))->m_capacity;
          ((vector<unsigned_int> *)((long)local_78 + uVar11 * 0x10))->m_capacity = uVar25;
          if (pvVar29[uVar13].m_size != 0) {
            pvVar4 = peVar15->m_p;
            uVar17 = 0;
            do {
              puVar5 = pvVar29[uVar13].m_p;
              puVar5[uVar17] = *(uint *)((long)pvVar4 + (ulong)puVar5[uVar17] * 4);
              uVar17 = uVar17 + 1;
            } while (uVar17 < pvVar29[uVar13].m_size);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (uStack_70 & 0xffffffff));
      }
    }
    auVar7 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      uVar11 = uStack_70 & 0xffffffff;
      if (uVar11 != 0) {
        lVar27 = 0;
        do {
          pvVar4 = *(void **)((long)(uint **)auVar7 + lVar27);
          if (pvVar4 != (void *)0x0) {
            crnlib_free(pvVar4);
          }
          lVar27 = lVar27 + 0x10;
        } while (uVar11 << 4 != lVar27);
      }
      crnlib_free((void *)local_78);
    }
    peVar15 = &local_a8;
    pwVar14 = &local_88;
    bVar6 = bVar8 & bVar22;
    bVar22 = false;
  } while (bVar6 != 0);
LAB_00142db3:
  lVar27 = 0x20;
  do {
    if (*(void **)((long)&local_c8 + lVar27) != (void *)0x0) {
      crnlib_free(*(void **)((long)&local_c8 + lVar27));
    }
    lVar27 = lVar27 + -0x10;
  } while (lVar27 != 0);
  lVar27 = 0x20;
  do {
    pvVar4 = *(void **)((long)&local_a8.m_p + lVar27);
    if (pvVar4 != (void *)0x0) {
      crnlib_free(pvVar4);
    }
    lVar27 = lVar27 + -0x10;
  } while (lVar27 != 0);
  return bVar8;
}

Assistant:

bool qdxt5::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices)
    {
        weighted_selector_vec_array selector_vecs[2];
        crnlib::vector<uint> selector_vec_remap[2];

        for (uint block_type = 0; block_type < 2; block_type++)
        {
            for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++)
            {
                dxt5_block& dxt5_block = get_block(block_iter);
                if ((uint)dxt5_block.is_alpha6_block() != block_type)
                {
                    continue;
                }

                vec16F sv;
                float* pDst = &sv[0];

                bool uses_absolute_values = false;

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        const uint s = dxt5_block.get_selector(x, y);

                        float f;
                        if (dxt5_block.is_alpha6_block())
                        {
                            if (s >= 6)
                            {
                                uses_absolute_values = true;
                                f = 0.0f;
                            }
                            else
                            {
                                f = g_dxt5_alpha6_to_linear[s];
                            }
                        }
                        else
                        {
                            f = g_dxt5_to_linear[s];
                        }

                        *pDst++ = f;
                    }
                }

                if (uses_absolute_values)
                {
                    continue;
                }

                int low_alpha = dxt5_block.get_low_alpha();
                int high_alpha = dxt5_block.get_high_alpha();
                int dist = math::square(low_alpha - high_alpha);

                const uint cAlphaDistToWeight = 8;
                const uint cMaxWeight = 2048;
                uint weight = math::clamp<uint>(dist / cAlphaDistToWeight, 1, cMaxWeight);

                selector_vecs[block_type].resize(selector_vecs[block_type].size() + 1);
                selector_vecs[block_type].back().m_vec = sv;
                selector_vecs[block_type].back().m_weight = weight;

                selector_vec_remap[block_type].push_back(block_iter);
            }
        }

        selector_cluster_indices.clear();

        for (uint block_type = 0; block_type < 2; block_type++)
        {
            if (selector_vecs[block_type].empty())
            {
                continue;
            }

            if ((selector_vecs[block_type].size() / (float)m_num_blocks) < .01f)
            {
                continue;
            }
            uint max_clusters = static_cast<uint>((math::emulu(selector_vecs[block_type].size(), max_selector_clusters) + (m_num_blocks - 1)) / m_num_blocks);
            max_clusters = math::minimum(math::maximum(64U, max_clusters), selector_vecs[block_type].size());
            if (max_clusters >= selector_vecs[block_type].size())
            {
                continue;
            }

#if QDXT5_DEBUGGING
            trace("max_clusters (%u): %u\n", block_type, max_clusters);
#endif

            crnlib::vector<crnlib::vector<uint>> block_type_selector_cluster_indices;

            if (!block_type)
            {
                m_progress_start = m_progress_range;
                m_progress_range = 16;
            }
            else
            {
                m_progress_start = m_progress_range + 16;
                m_progress_range = 17;
            }

            if (!m_selector_clusterizer.create_clusters(
                    selector_vecs[block_type], max_clusters, block_type_selector_cluster_indices, generate_codebook_progress_callback, this))
            {
                return false;
            }

            const uint first_cluster = selector_cluster_indices.size();
            selector_cluster_indices.enlarge(block_type_selector_cluster_indices.size());

            for (uint i = 0; i < block_type_selector_cluster_indices.size(); i++)
            {
                crnlib::vector<uint>& indices = selector_cluster_indices[first_cluster + i];
                indices.swap(block_type_selector_cluster_indices[i]);

                for (uint j = 0; j < indices.size(); j++)
                {
                    indices.at(j) = selector_vec_remap[block_type][indices.at(j)];
                }
            }
        }

        return true;
    }